

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cpp
# Opt level: O2

int __thiscall
xercesc_4_0::RegularExpression::matchUnion
          (RegularExpression *this,Context *context,Op *op,XMLSize_t offset)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar4;
  bool bVar5;
  uint local_104;
  Context bestResultContext;
  Context tmpContext;
  
  iVar1 = (*op->_vptr_Op[4])(op);
  Context::Context(&bestResultContext,XMLPlatformUtils::fgMemoryManager);
  local_104 = 0xffffffff;
  lVar4 = 0;
  do {
    if (CONCAT44(extraout_var,iVar1) == lVar4) break;
    Context::Context(&tmpContext,context);
    iVar2 = (*op->_vptr_Op[5])(op,lVar4);
    uVar3 = match(this,&tmpContext,(Op *)CONCAT44(extraout_var_00,iVar2),offset);
    bVar5 = true;
    if ((-1 < (int)uVar3) && ((int)local_104 < (int)uVar3 && (ulong)uVar3 <= context->fLimit)) {
      Context::operator=(&bestResultContext,&tmpContext);
      bVar5 = context->fLimit != (ulong)uVar3;
      local_104 = uVar3;
    }
    Context::~Context(&tmpContext);
    lVar4 = lVar4 + 1;
  } while (bVar5);
  if (local_104 != 0xffffffff) {
    Context::operator=(context,&bestResultContext);
  }
  Context::~Context(&bestResultContext);
  return local_104;
}

Assistant:

int RegularExpression::matchUnion(Context* const context,
                                   const Op* const op, XMLSize_t offset) const
{
    XMLSize_t opSize = op->getSize();

    Context bestResultContext;
    int bestResult=-1;
    for(XMLSize_t i=0; i < opSize; i++) {
        Context tmpContext(context);
        int ret = match(&tmpContext, op->elementAt(i), offset);
        if (ret >= 0 && (XMLSize_t)ret <= context->fLimit && ret>bestResult)
        {
            bestResult=ret;
            bestResultContext=tmpContext;
            // exit early, if we reached the end of the string
            if((XMLSize_t)ret == context->fLimit)
                break;
        }
    }
    if(bestResult!=-1)
        *context=bestResultContext;
    return bestResult;
}